

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O0

void mul(int64_t *o,int64_t *a,int64_t *b)

{
  ulong local_128;
  size_t j;
  size_t i;
  int64_t t [31];
  int64_t *b_local;
  int64_t *a_local;
  int64_t *o_local;
  
  for (j = 0; j < 0x1f; j = j + 1) {
    t[j - 1] = 0;
  }
  for (j = 0; j < 0x10; j = j + 1) {
    for (local_128 = 0; local_128 < 0x10; local_128 = local_128 + 1) {
      t[j + local_128 + -1] = a[j] * b[local_128] + t[j + local_128 + -1];
    }
  }
  for (j = 0; j < 0xf; j = j + 1) {
    t[j - 1] = t[j + 0xf] * 0x26 + t[j - 1];
  }
  for (j = 0; j < 0x10; j = j + 1) {
    o[j] = t[j - 1];
  }
  t[0x1e] = (int64_t)b;
  car25519(o);
  car25519(o);
  return;
}

Assistant:

static void mul(gf o, const gf a, const gf b)
{
  int64_t t[31];
  size_t i, j;

  for (i = 0; i < 31; i++)
    t[i] = 0;

  for (i = 0; i < 16; i++)
    for (j = 0; j < 16; j++)
      t[i + j] += a[i] * b[j];

  for (i = 0; i < 15; i++)
    t[i] += 38 * t[i + 16];

  for (i = 0; i < 16; i++)
    o[i] = t[i];

  car25519(o);
  car25519(o);
}